

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::setup_credentials(Container *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  iVar1 = setresgid(this->id_,this->id_,this->id_);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Setting process gid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = setgroups(0,(__gid_t *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Removing process from all groups failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  iVar1 = setresuid(this->id_,this->id_,this->id_);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_80,"Setting process uid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  iVar1 = setpgrp();
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_a0,"Setting process group id failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void Container::setup_credentials() {
    if (setresgid(id_, id_, id_) != 0) {
        die(format("Setting process gid to %d failed: %m", id_));
    }
    if (setgroups(0, nullptr) != 0) {
        die(format("Removing process from all groups failed: %m"));
    }
    if (setresuid(id_, id_, id_) != 0) {
        die(format("Setting process uid to %d failed: %m", id_));
    }
    if (setpgrp() != 0) {
        die(format("Setting process group id failed: %m"));
    }
}